

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::cftfx41(int n,double *a,int nw,double *w)

{
  int in_EDI;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000020;
  double *in_stack_000000a8;
  double *in_stack_000000b0;
  double *in_stack_000000b8;
  double *in_stack_000000c0;
  
  if (in_EDI == 0x80) {
    cftf161(in_stack_000000b0,in_stack_000000a8);
    cftf162(in_stack_000000c0,in_stack_000000b8);
    cftf161(in_stack_000000b0,in_stack_000000a8);
    cftf161(in_stack_000000b0,in_stack_000000a8);
  }
  else {
    cftf081((double *)CONCAT44(n,in_stack_00000020),a);
    cftf082((double *)CONCAT44(nw,in_stack_00000010),w);
    cftf081((double *)CONCAT44(n,in_stack_00000020),a);
    cftf081((double *)CONCAT44(n,in_stack_00000020),a);
  }
  return;
}

Assistant:

void cftfx41(int n, double *a, int nw, double *w) {
#if 0
  void cftf161(double *a, double *w);
  void cftf162(double *a, double *w);
  void cftf081(double *a, double *w);
  void cftf082(double *a, double *w);
#endif

  if (n == 128) {
    cftf161(a, &w[nw - 8]);
    cftf162(&a[32], &w[nw - 32]);
    cftf161(&a[64], &w[nw - 8]);
    cftf161(&a[96], &w[nw - 8]);
  } else {
    cftf081(a, &w[nw - 8]);
    cftf082(&a[16], &w[nw - 8]);
    cftf081(&a[32], &w[nw - 8]);
    cftf081(&a[48], &w[nw - 8]);
  }
}